

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O3

void __thiscall cmCTestCurl::SetProxyType(cmCTestCurl *this)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  curl_proxytype cVar4;
  string type;
  string passwd;
  string port;
  string local_88;
  string local_68;
  string local_48;
  
  psVar1 = &this->HTTPProxy;
  (this->HTTPProxy)._M_string_length = 0;
  *(this->HTTPProxy)._M_dataplus._M_p = '\0';
  this->HTTPProxyType = CURLPROXY_HTTP;
  (this->HTTPProxyAuth)._M_string_length = 0;
  *(this->HTTPProxyAuth)._M_dataplus._M_p = '\0';
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY",psVar1);
  if (!bVar2) {
    return;
  }
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PORT",&local_48);
  if (bVar2) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_48._M_dataplus._M_p);
  }
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_TYPE",&local_88);
  psVar1 = &this->HTTPProxyAuth;
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar3 == 0) {
      cVar4 = CURLPROXY_HTTP;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar3 == 0) {
        cVar4 = CURLPROXY_SOCKS4;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar3 != 0) goto LAB_001fa22c;
        cVar4 = CURLPROXY_SOCKS5;
      }
    }
    this->HTTPProxyType = cVar4;
  }
LAB_001fa22c:
  cmsys::SystemTools::GetEnv("HTTP_PROXY_USER",psVar1);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar2 = cmsys::SystemTools::GetEnv("HTTP_PROXY_PASSWD",&local_68);
  if (bVar2) {
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCTestCurl::SetProxyType()
{
  this->HTTPProxy.clear();
  // this is the default
  this->HTTPProxyType = CURLPROXY_HTTP;
  this->HTTPProxyAuth.clear();
  if (cmSystemTools::GetEnv("HTTP_PROXY", this->HTTPProxy)) {
    std::string port;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PORT", port)) {
      this->HTTPProxy += ":";
      this->HTTPProxy += port;
    }
    std::string type;
    if (cmSystemTools::GetEnv("HTTP_PROXY_TYPE", type)) {
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = CURLPROXY_HTTP;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = CURLPROXY_SOCKS4;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = CURLPROXY_SOCKS5;
      }
    }
    cmSystemTools::GetEnv("HTTP_PROXY_USER", this->HTTPProxyAuth);
    std::string passwd;
    if (cmSystemTools::GetEnv("HTTP_PROXY_PASSWD", passwd)) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += passwd;
    }
  }
}